

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL_gpu.c
# Opt level: O1

void GPU_Flip(GPU_Target *target)

{
  char *pcVar1;
  
  if (_gpu_current_renderer == (GPU_Renderer *)0x0) {
    pcVar1 = "NULL renderer";
  }
  else {
    if ((target != (GPU_Target *)0x0) && (target->context == (GPU_Context *)0x0)) {
      (*_gpu_current_renderer->impl->FlushBlitBuffer)(_gpu_current_renderer);
      return;
    }
    if (((target != (GPU_Target *)0x0) &&
        (_gpu_current_renderer->current_context_target == (GPU_Target *)0x0)) &&
       (target->context != (GPU_Context *)0x0)) {
      (*_gpu_current_renderer->impl->MakeCurrent)
                (_gpu_current_renderer,target,target->context->windowID);
    }
    if (_gpu_current_renderer->current_context_target != (GPU_Target *)0x0) {
      (*_gpu_current_renderer->impl->Flip)(_gpu_current_renderer,target);
      return;
    }
    pcVar1 = "NULL context";
  }
  GPU_PushErrorCode("GPU_Flip",GPU_ERROR_USER_ERROR,"%s",pcVar1);
  return;
}

Assistant:

void GPU_Flip(GPU_Target* target)
{
    if(!CHECK_RENDERER)
        RETURN_ERROR(GPU_ERROR_USER_ERROR, "NULL renderer");
    
    if(target != NULL && target->context == NULL)
    {
        _gpu_current_renderer->impl->FlushBlitBuffer(_gpu_current_renderer);
        return;
    }
    
    MAKE_CURRENT_IF_NONE(target);
    if(!CHECK_CONTEXT)
        RETURN_ERROR(GPU_ERROR_USER_ERROR, "NULL context");

    _gpu_current_renderer->impl->Flip(_gpu_current_renderer, target);
}